

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitTOIDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
PlanningUnitTOIDecPOMDPDiscrete::SetProblem
          (PlanningUnitTOIDecPOMDPDiscrete *this,TOIDecPOMDPDiscrete *p)

{
  long in_RSI;
  DecPOMDPDiscreteInterface *in_RDI;
  PlanningUnitDecPOMDPDiscrete *unaff_retaddr;
  
  if (in_RSI != *(long *)&in_RDI[0x33].field_0x8) {
    *(long *)&in_RDI[0x33].field_0x8 = in_RSI;
    PlanningUnitDecPOMDPDiscrete::SetProblem(unaff_retaddr,in_RDI);
    (**(code **)(*(long *)in_RDI + 0x28))();
  }
  return;
}

Assistant:

void PlanningUnitTOIDecPOMDPDiscrete::SetProblem(TOIDecPOMDPDiscrete* p)
{
    if(p == _m_TOIDecPOMDPDiscrete)
        return;
    _m_TOIDecPOMDPDiscrete=p;
#if 0
    //set (and initialize) the problem at PlanningUnitDecPOMDPDiscrete level:
    DecPOMDPDiscreteInterface* p2 = 
        static_cast<DecPOMDPDiscreteInterface*>(p);
#endif
    PlanningUnitDecPOMDPDiscrete::SetProblem(p);

    SanityCheck();
}